

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O3

bool not_empty(v_array<v_array<unsigned_int>_> tournaments)

{
  v_array<unsigned_int> *pvVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  uint **ppuVar5;
  ulong uVar6;
  
  if ((long)tournaments._end - (long)tournaments._begin == 0) {
    return false;
  }
  uVar4 = (long)tournaments._end - (long)tournaments._begin >> 5;
  if ((tournaments._begin)->_end != (tournaments._begin)->_begin) {
    return true;
  }
  ppuVar5 = &tournaments._begin[1]._end;
  uVar3 = 1;
  do {
    uVar6 = uVar3;
    if (uVar4 + (uVar4 == 0) == uVar6) break;
    puVar2 = *ppuVar5;
    pvVar1 = (v_array<unsigned_int> *)(ppuVar5 + -1);
    ppuVar5 = ppuVar5 + 4;
    uVar3 = uVar6 + 1;
  } while (puVar2 == pvVar1->_begin);
  return uVar6 < uVar4;
}

Assistant:

bool not_empty(v_array<v_array<uint32_t>> tournaments)
{
  for (size_t i = 0; i < tournaments.size(); i++)
  {
    if (tournaments[i].size() > 0)
      return true;
  }
  return false;
}